

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzerResults.cpp
# Opt level: O2

void __thiscall
HdlcAnalyzerResults::GenerateExportFile
          (HdlcAnalyzerResults *this,char *file,DisplayBase display_base,U32 param_3)

{
  bool bVar1;
  undefined8 uVar2;
  undefined2 uVar3;
  char cVar4;
  uint uVar5;
  HdlcFrameType HVar6;
  ulonglong uVar7;
  ostream *poVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  bool bVar13;
  Frame fcsFrame;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  char local_398;
  uint local_384;
  int local_380;
  Frame firstAddressFrame;
  undefined1 uStack_377;
  undefined1 uStack_376;
  undefined1 uStack_375;
  undefined1 uStack_374;
  undefined1 uStack_373;
  undefined1 uStack_372;
  undefined1 uStack_371;
  char local_358;
  string sep_1;
  char local_330;
  string sep;
  char escapeStr [5];
  char addressStr [64];
  ofstream fileStream;
  char timeStr [64];
  
  std::ofstream::ofstream(&fileStream,file,_S_out);
  uVar7 = Analyzer::GetTriggerSample();
  uVar5 = Analyzer::GetSampleRate();
  uVar9 = (ulong)this->mSettings->mHdlcFcs;
  local_384 = 0;
  if (uVar9 < 3) {
    local_384 = *(uint *)(&DAT_00110168 + uVar9 * 4);
  }
  poVar8 = std::operator<<((ostream *)&fileStream,"Time[s],Address,Control,Information,FCS");
  std::endl<char,std::char_traits<char>>(poVar8);
  AnalyzerHelpers::GetNumberString(0x7d,display_base,8,escapeStr,5);
  uVar9 = AnalyzerResults::GetNumFrames();
  uVar10 = (ulong)this->mSettings->mHdlcControl;
  local_380 = 0;
  if (uVar10 < 4) {
    local_380 = *(int *)(&DAT_001102ac + uVar10 * 4);
  }
  if (uVar9 == 0) {
    AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,0);
  }
  else {
    uVar10 = 0;
    do {
      while( true ) {
        Frame::Frame(&firstAddressFrame);
        while( true ) {
          AnalyzerResults::GetFrame((ulonglong)addressStr);
          uVar3 = addressStr._32_2_;
          firstAddressFrame = (Frame)addressStr[0];
          uStack_377 = addressStr[1];
          uStack_376 = addressStr[2];
          uStack_375 = addressStr[3];
          uStack_374 = addressStr[4];
          uStack_373 = addressStr[5];
          uStack_372 = addressStr[6];
          uStack_371 = addressStr[7];
          Frame::~Frame((Frame *)addressStr);
          local_358 = (char)uVar3;
          if ((byte)(local_358 - 1U) < 2) break;
          uVar10 = uVar10 + 1;
          if (uVar9 <= uVar10) {
            AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar10);
            goto LAB_0010cf44;
          }
        }
        AnalyzerHelpers::GetTimeString(_firstAddressFrame,uVar7,uVar5,timeStr,0x40);
        poVar8 = std::operator<<((ostream *)&fileStream,timeStr);
        std::operator<<(poVar8,",");
        if (this->mSettings->mHdlcAddr == HDLC_BASIC_ADDRESS_FIELD) break;
        Frame::Frame(&fcsFrame,&firstAddressFrame);
        while (local_398 == '\x02') {
          AnalyzerHelpers::GetNumberString
                    (local_3a8._M_allocated_capacity,display_base,8,addressStr,0x40);
          if ((local_3a8._M_allocated_capacity & 1) == 0 && local_3a8._8_8_ == 0) {
            sep._M_dataplus._M_p = (pointer)&sep.field_2;
            sep._M_string_length = 0;
            sep.field_2._M_local_buf[0] = '\0';
          }
          else {
            std::__cxx11::string::string((string *)&sep," ",(allocator *)&sep_1);
          }
          poVar8 = std::operator<<((ostream *)&fileStream,(string *)&sep);
          EscapeByteStr_abi_cxx11_(&sep_1,this,&fcsFrame);
          poVar8 = std::operator<<(poVar8,(string *)&sep_1);
          std::operator<<(poVar8,addressStr);
          std::__cxx11::string::~string((string *)&sep_1);
          if ((local_3a8._M_allocated_capacity & 1) == 0) {
            std::operator<<((ostream *)&fileStream,",");
            std::__cxx11::string::~string((string *)&sep);
            goto LAB_0010cb41;
          }
          if (uVar9 <= uVar10 + 1) {
            uVar10 = uVar10 + 1;
            AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar10);
            std::__cxx11::string::~string((string *)&sep);
            bVar13 = false;
            goto LAB_0010cb6c;
          }
          AnalyzerResults::GetFrame((ulonglong)&sep_1);
          local_3a8._M_allocated_capacity =
               CONCAT71(sep_1.field_2._M_allocated_capacity._1_7_,sep_1.field_2._M_local_buf[0]);
          local_3a8._8_8_ = sep_1.field_2._8_8_;
          _fcsFrame = sep_1._M_dataplus._M_p;
          Frame::~Frame((Frame *)&sep_1);
          std::__cxx11::string::~string((string *)&sep);
          uVar10 = uVar10 + 1;
          local_398 = local_330;
        }
        if (local_398 == '\a') {
          poVar8 = std::operator<<((ostream *)&fileStream,",");
          bVar13 = true;
          std::endl<char,std::char_traits<char>>(poVar8);
          bVar1 = true;
        }
        else {
          poVar8 = std::operator<<((ostream *)&fileStream,",");
          std::endl<char,std::char_traits<char>>(poVar8);
LAB_0010cb41:
          bVar13 = true;
LAB_0010cb6c:
          bVar1 = false;
        }
        Frame::~Frame(&fcsFrame);
        if (!bVar13) goto LAB_0010cf44;
        if (!bVar1) goto LAB_0010cb92;
LAB_0010ce6d:
        Frame::~Frame(&firstAddressFrame);
      }
      AnalyzerResults::GetFrame((ulonglong)addressStr);
      uVar3 = addressStr._32_2_;
      uVar2 = addressStr._16_8_;
      firstAddressFrame = (Frame)addressStr[0];
      uStack_377 = addressStr[1];
      uStack_376 = addressStr[2];
      uStack_375 = addressStr[3];
      uStack_374 = addressStr[4];
      uStack_373 = addressStr[5];
      uStack_372 = addressStr[6];
      uStack_371 = addressStr[7];
      Frame::~Frame((Frame *)addressStr);
      local_358 = (char)uVar3;
      if (local_358 != '\x01') {
        poVar8 = std::operator<<((ostream *)&fileStream,",");
        std::endl<char,std::char_traits<char>>(poVar8);
        goto LAB_0010ce6d;
      }
      AnalyzerHelpers::GetNumberString(uVar2,display_base,8,addressStr,0x40);
      EscapeByteStr_abi_cxx11_((string *)&fcsFrame,this,&firstAddressFrame);
      poVar8 = std::operator<<((ostream *)&fileStream,(string *)&fcsFrame);
      poVar8 = std::operator<<(poVar8,addressStr);
      std::operator<<(poVar8,",");
      std::__cxx11::string::~string((string *)&fcsFrame);
      bVar1 = false;
LAB_0010cb92:
      bVar13 = false;
      for (iVar11 = 0; local_380 != iVar11; iVar11 = iVar11 + 1) {
        if (uVar9 <= uVar10 + 1) {
          AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar10 + 1);
          goto LAB_0010cf44;
        }
        AnalyzerResults::GetFrame((ulonglong)&fcsFrame);
        if (local_398 == '\a') {
          poVar8 = std::operator<<((ostream *)&fileStream,",");
          bVar1 = true;
          std::endl<char,std::char_traits<char>>(poVar8);
LAB_0010cd34:
          Frame::~Frame(&fcsFrame);
          uVar10 = uVar10 + 1;
          break;
        }
        if ((byte)(local_398 - 3U) < 2) {
          if (iVar11 == 0) {
            HVar6 = HdlcAnalyzer::GetFrameType(local_3a8._M_local_buf[0]);
            bVar13 = HVar6 == HDLC_U_FRAME;
          }
          AnalyzerHelpers::GetNumberString
                    (local_3a8._M_allocated_capacity,display_base,8,addressStr,0x40);
          if ((bVar13) || (this->mSettings->mHdlcControl == HDLC_BASIC_CONTROL_FIELD)) {
            sep_1._M_dataplus._M_p = (pointer)&sep_1.field_2;
            sep_1._M_string_length = 0;
            sep_1.field_2._M_local_buf[0] = '\0';
          }
          else {
            std::__cxx11::string::string((string *)&sep_1," ",(allocator *)&sep);
          }
          poVar8 = std::operator<<((ostream *)&fileStream,sep_1._M_dataplus._M_p);
          EscapeByteStr_abi_cxx11_(&sep,this,&fcsFrame);
          poVar8 = std::operator<<(poVar8,(string *)&sep);
          std::operator<<(poVar8,addressStr);
          std::__cxx11::string::~string((string *)&sep);
          std::__cxx11::string::~string((string *)&sep_1);
          if ((bool)(bVar13 & iVar11 == 0)) goto LAB_0010cd34;
        }
        else {
          poVar8 = std::operator<<((ostream *)&fileStream,",");
          std::endl<char,std::char_traits<char>>(poVar8);
        }
        Frame::~Frame(&fcsFrame);
        uVar10 = uVar10 + 1;
      }
      if (bVar1) goto LAB_0010ce6d;
      std::operator<<((ostream *)&fileStream,",");
      uVar12 = uVar10 + 1;
      if (uVar9 <= uVar12) {
        AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar12);
LAB_0010cf44:
        Frame::~Frame(&firstAddressFrame);
        break;
      }
      while (AnalyzerResults::GetFrame((ulonglong)&fcsFrame), local_398 == '\x05') {
        AnalyzerHelpers::GetNumberString
                  (local_3a8._M_allocated_capacity,display_base,8,addressStr,0x40);
        poVar8 = std::operator<<((ostream *)&fileStream," ");
        EscapeByteStr_abi_cxx11_(&sep_1,this,&fcsFrame);
        poVar8 = std::operator<<(poVar8,(string *)&sep_1);
        std::operator<<(poVar8,addressStr);
        std::__cxx11::string::~string((string *)&sep_1);
        uVar12 = uVar12 + 1;
        if (uVar9 <= uVar12) {
          AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar9);
          goto LAB_0010cfa0;
        }
        Frame::~Frame(&fcsFrame);
      }
      if (local_398 != '\a') {
        std::operator<<((ostream *)&fileStream,",");
      }
      else {
        poVar8 = std::operator<<((ostream *)&fileStream,",");
        std::endl<char,std::char_traits<char>>(poVar8);
      }
      Frame::~Frame(&fcsFrame);
      uVar10 = uVar12;
      if (local_398 == '\a') goto LAB_0010ce6d;
      AnalyzerResults::GetFrame((ulonglong)&fcsFrame);
      if (local_398 == '\x06') {
        AnalyzerHelpers::GetNumberString
                  (local_3a8._M_allocated_capacity,display_base,local_384,addressStr,0x80);
        poVar8 = std::operator<<((ostream *)&fileStream,addressStr);
        std::endl<char,std::char_traits<char>>(poVar8);
      }
      else {
        poVar8 = std::operator<<((ostream *)&fileStream,",");
        std::endl<char,std::char_traits<char>>(poVar8);
      }
      uVar10 = uVar12 + 1;
      if (uVar9 <= uVar10) {
        AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar12 + 1);
LAB_0010cfa0:
        Frame::~Frame(&fcsFrame);
        goto LAB_0010cf44;
      }
      cVar4 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar10);
      Frame::~Frame(&fcsFrame);
      Frame::~Frame(&firstAddressFrame);
    } while (cVar4 == '\0');
  }
  std::ofstream::~ofstream(&fileStream);
  return;
}

Assistant:

void HdlcAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 /*export_type_user_id*/ )
{
    ofstream fileStream( file, ios::out );

    U64 triggerSample = mAnalyzer->GetTriggerSample();
    U32 sampleRate = mAnalyzer->GetSampleRate();

    const char* sepChar = " ";

    U8 fcsBits = 0;
    switch( mSettings->mHdlcFcs )
    {
    case HDLC_CRC8:
        fcsBits = 8;
        break;
    case HDLC_CRC16:
        fcsBits = 16;
        break;
    case HDLC_CRC32:
        fcsBits = 32;
        break;
    }

    fileStream << "Time[s],Address,Control,Information,FCS" << endl;

    char escapeStr[ 5 ];
    AnalyzerHelpers::GetNumberString( HDLC_ESCAPE_SEQ_VALUE, display_base, 8, escapeStr, 5 );

    U64 numFrames = GetNumFrames();
    U64 frameNumber = 0;

    U32 numberOfControlBytes = 0;
    switch( mSettings->mHdlcControl )
    {
    case HDLC_BASIC_CONTROL_FIELD:
        numberOfControlBytes = 1;
        break;
    case HDLC_EXTENDED_CONTROL_FIELD_MOD_128:
        numberOfControlBytes = 2;
        break;
    case HDLC_EXTENDED_CONTROL_FIELD_MOD_32768:
        numberOfControlBytes = 4;
        break;
    case HDLC_EXTENDED_CONTROL_FIELD_MOD_2147483648:
        numberOfControlBytes = 8;
        break;
    }

    if( numFrames == 0 )
    {
        UpdateExportProgressAndCheckForCancel( frameNumber, numFrames );
        return;
    }

    for( ;; )
    {
        bool doAbortFrame = false;
        // Re-sync to start reading HDLC frames from the Address Byte
        Frame firstAddressFrame;
        for( ;; )
        {
            firstAddressFrame = GetFrame( frameNumber );

            // Check for abort
            if( firstAddressFrame.mType == HDLC_FIELD_BASIC_ADDRESS ||
                firstAddressFrame.mType == HDLC_FIELD_EXTENDED_ADDRESS ) // It's and address frame
            {
                break;
            }
            else
            {
                frameNumber++;
                if( frameNumber >= numFrames )
                {
                    UpdateExportProgressAndCheckForCancel( frameNumber, numFrames );
                    return;
                }
            }
        }

        // 1)  Time [s]
        char timeStr[ 64 ];
        AnalyzerHelpers::GetTimeString( firstAddressFrame.mStartingSampleInclusive, triggerSample, sampleRate, timeStr, 64 );
        fileStream << timeStr << ",";

        // 2) Address Field
        if( mSettings->mHdlcAddr == HDLC_BASIC_ADDRESS_FIELD )
        {
            firstAddressFrame = GetFrame( frameNumber );
            if( firstAddressFrame.mType != HDLC_FIELD_BASIC_ADDRESS )
            {
                fileStream << "," << endl;
                continue;
            }

            char addressStr[ 64 ];
            AnalyzerHelpers::GetNumberString( firstAddressFrame.mData1, display_base, 8, addressStr, 64 );
            fileStream << EscapeByteStr( firstAddressFrame ) << addressStr << ",";
        }
        else // Check for extended address
        {
            Frame nextAddress = firstAddressFrame;
            for( ;; )
            {
                // Check for abort
                if( nextAddress.mType == HDLC_ABORT_SEQ )
                {
                    fileStream << "," << endl;
                    doAbortFrame = true;
                    break;
                }

                if( nextAddress.mType != HDLC_FIELD_EXTENDED_ADDRESS ) // ERROR
                {
                    fileStream << "," << endl;
                    break;
                }

                bool endOfAddress = ( ( nextAddress.mData1 & 0x01 ) == 0 );

                char addressStr[ 64 ];
                AnalyzerHelpers::GetNumberString( nextAddress.mData1, display_base, 8, addressStr, 64 );
                string sep = ( endOfAddress && nextAddress.mData2 == 0 ) ? string() : string( sepChar );
                fileStream << sep << EscapeByteStr( nextAddress ) << addressStr;

                if( endOfAddress ) // no more bytes of address?
                {
                    fileStream << ",";
                    break;
                }
                else
                {
                    frameNumber++;
                    if( frameNumber >= numFrames )
                    {
                        UpdateExportProgressAndCheckForCancel( frameNumber, numFrames );
                        return;
                    }
                    nextAddress = GetFrame( frameNumber );
                }
            }
        }

        if( doAbortFrame )
        {
            continue;
        }

        // 3) Control Field
        bool isUFrame = false;
        for( U32 i = 0; i < numberOfControlBytes; ++i )
        {
            frameNumber++;
            if( frameNumber >= numFrames )
            {
                UpdateExportProgressAndCheckForCancel( frameNumber, numFrames );
                return;
            }

            Frame controlFrame = GetFrame( frameNumber );

            // Check for abort
            if( controlFrame.mType == HDLC_ABORT_SEQ )
            {
                doAbortFrame = true;
                fileStream << "," << endl;
                break;
            }

            if( !( controlFrame.mType == HDLC_FIELD_BASIC_CONTROL || controlFrame.mType == HDLC_FIELD_EXTENDED_CONTROL ) ) // ERROR
            {
                fileStream << "," << endl;
                continue;
            }

            if( i == 0 )
            {
                isUFrame = HdlcAnalyzer::GetFrameType( controlFrame.mData1 ) == HDLC_U_FRAME;
            }

            char controlStr[ 64 ];
            AnalyzerHelpers::GetNumberString( controlFrame.mData1, display_base, 8, controlStr, 64 );
            string sep = ( isUFrame || mSettings->mHdlcControl == HDLC_BASIC_CONTROL_FIELD ) ? string() : string( sepChar );
            fileStream << sep.c_str() << EscapeByteStr( controlFrame ) << controlStr;

            if( i == 0 && isUFrame )
            {
                break;
            }
        }

        if( doAbortFrame )
        {
            continue;
        }

        fileStream << ",";

        frameNumber++;
        if( frameNumber >= numFrames )
        {
            UpdateExportProgressAndCheckForCancel( frameNumber, numFrames );
            return;
        }

        // 5) Information Fields
        for( ;; )
        {
            Frame infoFrame = GetFrame( frameNumber );

            // Check for abort
            if( infoFrame.mType == HDLC_ABORT_SEQ )
            {
                doAbortFrame = true;
                fileStream << "," << endl;
                break;
            }

            // Check for flag
            if( infoFrame.mType == HDLC_FIELD_FLAG )
            {
                fileStream << ",";
                break;
            }

            // Check for info byte
            if( infoFrame.mType == HDLC_FIELD_INFORMATION ) // ERROR
            {
                char infoByteStr[ 64 ];
                AnalyzerHelpers::GetNumberString( infoFrame.mData1, display_base, 8, infoByteStr, 64 );
                fileStream << sepChar << EscapeByteStr( infoFrame ) << infoByteStr;
                frameNumber++;
                if( frameNumber >= numFrames )
                {
                    UpdateExportProgressAndCheckForCancel( frameNumber, numFrames );
                    return;
                }
            }
            else
            {
                fileStream << ",";
                break;
            }
        }

        if( doAbortFrame )
        {
            continue;
        }

        // 6) FCS Field
        Frame fcsFrame = GetFrame( frameNumber );
        if( fcsFrame.mType != HDLC_FIELD_FCS )
        {
            fileStream << "," << endl;
        }
        else // HDLC_FIELD_FCS Frame
        {
            char fcsStr[ 128 ];
            AnalyzerHelpers::GetNumberString( fcsFrame.mData1, display_base, fcsBits, fcsStr, 128 );
            fileStream << fcsStr << endl;
        }

        frameNumber++;
        if( frameNumber >= numFrames )
        {
            UpdateExportProgressAndCheckForCancel( frameNumber, numFrames );
            return;
        }

        if( UpdateExportProgressAndCheckForCancel( frameNumber, numFrames ) )
        {
            return;
        }
    }

    UpdateExportProgressAndCheckForCancel( frameNumber, numFrames );
}